

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLElement::DeleteAttribute(XMLElement *this,char *name)

{
  bool bVar1;
  XMLAttribute *in_RSI;
  char *in_RDI;
  XMLAttribute *a;
  XMLAttribute *prev;
  int in_stack_ffffffffffffffcc;
  XMLAttribute *attribute;
  long local_20;
  long local_18;
  
  local_18 = 0;
  local_20 = *(long *)(in_RDI + 0x70);
  while( true ) {
    if (local_20 == 0) {
      return;
    }
    attribute = in_RSI;
    XMLAttribute::Name((XMLAttribute *)0x13e9ba);
    bVar1 = XMLUtil::StringEqual(in_RDI,(char *)attribute,in_stack_ffffffffffffffcc);
    if (bVar1) break;
    local_18 = local_20;
    local_20 = *(long *)(local_20 + 0x40);
  }
  if (local_18 == 0) {
    *(undefined8 *)(in_RDI + 0x70) = *(undefined8 *)(local_20 + 0x40);
  }
  else {
    *(undefined8 *)(local_18 + 0x40) = *(undefined8 *)(local_20 + 0x40);
  }
  DeleteAttribute(attribute);
  return;
}

Assistant:

void XMLElement::DeleteAttribute( const char* name )
{
    XMLAttribute* prev = 0;
    for( XMLAttribute* a=_rootAttribute; a; a=a->_next ) {
        if ( XMLUtil::StringEqual( name, a->Name() ) ) {
            if ( prev ) {
                prev->_next = a->_next;
            }
            else {
                _rootAttribute = a->_next;
            }
            DeleteAttribute( a );
            break;
        }
        prev = a;
    }
}